

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O3

void __thiscall facenet::Reduction_B(facenet *this,pBox *input,pBox *output)

{
  pBox *outpBox;
  pBox *outpBox_00;
  pBox *outpBox_01;
  pBox *outpBox_02;
  pBox *outpBox_03;
  pBox *outpBox_04;
  pBox *outpBox_05;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  Weight *weight_05;
  pBox *Matrix;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  BN *var_03;
  BN *mean_03;
  BN *beta_03;
  BN *var_04;
  BN *mean_04;
  BN *beta_04;
  BN *var_05;
  BN *mean_05;
  BN *beta_05;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  size_type *psVar10;
  string filename;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  string local_238;
  string __str;
  mydataFmt *pointTeam [28];
  long dataNumber [28];
  
  outpBox = (pBox *)operator_new(0x38);
  (outpBox->super_String)._M_dataplus._M_p = (pointer)&(outpBox->super_String).field_2;
  (outpBox->super_String)._M_string_length = 0;
  (outpBox->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_00 = (pBox *)operator_new(0x38);
  (outpBox_00->super_String)._M_dataplus._M_p = (pointer)&(outpBox_00->super_String).field_2;
  (outpBox_00->super_String)._M_string_length = 0;
  (outpBox_00->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_01 = (pBox *)operator_new(0x38);
  (outpBox_01->super_String)._M_dataplus._M_p = (pointer)&(outpBox_01->super_String).field_2;
  (outpBox_01->super_String)._M_string_length = 0;
  (outpBox_01->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_02 = (pBox *)operator_new(0x38);
  (outpBox_02->super_String)._M_dataplus._M_p = (pointer)&(outpBox_02->super_String).field_2;
  (outpBox_02->super_String)._M_string_length = 0;
  (outpBox_02->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_03 = (pBox *)operator_new(0x38);
  (outpBox_03->super_String)._M_dataplus._M_p = (pointer)&(outpBox_03->super_String).field_2;
  (outpBox_03->super_String)._M_string_length = 0;
  (outpBox_03->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_04 = (pBox *)operator_new(0x38);
  (outpBox_04->super_String)._M_dataplus._M_p = (pointer)&(outpBox_04->super_String).field_2;
  (outpBox_04->super_String)._M_string_length = 0;
  (outpBox_04->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_05 = (pBox *)operator_new(0x38);
  (outpBox_05->super_String)._M_dataplus._M_p = (pointer)&(outpBox_05->super_String).field_2;
  (outpBox_05->super_String)._M_string_length = 0;
  (outpBox_05->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  weight_05 = (Weight *)operator_new(0x38);
  Matrix = (pBox *)operator_new(0x38);
  (Matrix->super_String)._M_dataplus._M_p = (pointer)&(Matrix->super_String).field_2;
  (Matrix->super_String)._M_string_length = 0;
  (Matrix->super_String).field_2._M_local_buf[0] = '\0';
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  var_03 = (BN *)operator_new(0x10);
  mean_03 = (BN *)operator_new(0x10);
  beta_03 = (BN *)operator_new(0x10);
  var_04 = (BN *)operator_new(0x10);
  mean_04 = (BN *)operator_new(0x10);
  beta_04 = (BN *)operator_new(0x10);
  var_05 = (BN *)operator_new(0x10);
  mean_05 = (BN *)operator_new(0x10);
  beta_05 = (BN *)operator_new(0x10);
  lVar1 = ConvAndFcInit(weight,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0x100);
  lVar2 = ConvAndFcInit(weight_00,0x180,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0x180);
  lVar3 = ConvAndFcInit(weight_01,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta_01,mean_01,var_01,0x100);
  lVar4 = ConvAndFcInit(weight_02,0x100,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_02,mean_02,var_02,0x100);
  lVar5 = ConvAndFcInit(weight_03,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta_03,mean_03,var_03,0x100);
  lVar6 = ConvAndFcInit(weight_04,0x100,0x100,3,1,1,0,0,0,0);
  BatchNormInit(beta_04,mean_04,var_04,0x100);
  lVar7 = ConvAndFcInit(weight_05,0x100,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_05,mean_05,var_05,0x100);
  dataNumber[1] = 0x100;
  dataNumber[2] = 0x100;
  dataNumber[3] = 0x100;
  dataNumber[5] = 0x180;
  dataNumber[6] = 0x180;
  dataNumber[7] = 0x180;
  dataNumber[9] = 0x100;
  dataNumber[10] = 0x100;
  dataNumber[0xb] = 0x100;
  dataNumber[0xd] = 0x100;
  dataNumber[0xe] = 0x100;
  dataNumber[0xf] = 0x100;
  dataNumber[0x11] = 0x100;
  dataNumber[0x12] = 0x100;
  dataNumber[0x13] = 0x100;
  dataNumber[0x15] = 0x100;
  dataNumber[0x16] = 0x100;
  dataNumber[0x17] = 0x100;
  dataNumber[0x19] = 0x100;
  dataNumber[0x1a] = 0x100;
  dataNumber[0x1b] = 0x100;
  pointTeam[0] = weight->pdata;
  pointTeam[1] = beta->pdata;
  pointTeam[2] = mean->pdata;
  pointTeam[3] = var->pdata;
  pointTeam[4] = weight_00->pdata;
  pointTeam[5] = beta_00->pdata;
  pointTeam[6] = mean_00->pdata;
  pointTeam[7] = var_00->pdata;
  pointTeam[8] = weight_01->pdata;
  pointTeam[9] = beta_01->pdata;
  pointTeam[10] = mean_01->pdata;
  pointTeam[0xb] = var_01->pdata;
  pointTeam[0xc] = weight_02->pdata;
  pointTeam[0xd] = beta_02->pdata;
  pointTeam[0xe] = mean_02->pdata;
  pointTeam[0xf] = var_02->pdata;
  pointTeam[0x10] = weight_03->pdata;
  pointTeam[0x11] = beta_03->pdata;
  pointTeam[0x12] = mean_03->pdata;
  pointTeam[0x13] = var_03->pdata;
  pointTeam[0x14] = weight_04->pdata;
  pointTeam[0x15] = beta_04->pdata;
  pointTeam[0x16] = mean_04->pdata;
  pointTeam[0x17] = var_04->pdata;
  pointTeam[0x18] = weight_05->pdata;
  pointTeam[0x19] = beta_05->pdata;
  pointTeam[0x1a] = mean_05->pdata;
  pointTeam[0x1b] = var_05->pdata;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  dataNumber[0] = lVar1;
  dataNumber[4] = lVar2;
  dataNumber[8] = lVar3;
  dataNumber[0xc] = lVar4;
  dataNumber[0x10] = lVar5;
  dataNumber[0x14] = lVar6;
  dataNumber[0x18] = lVar7;
  std::__cxx11::string::_M_construct((ulong)&__str,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,3,0x80);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x114020);
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_248 = *plVar9;
    lStack_240 = plVar8[3];
    local_258 = &local_248;
  }
  else {
    local_248 = *plVar9;
    local_258 = (long *)*plVar8;
  }
  local_250 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    filename.field_2._M_allocated_capacity = *psVar10;
    filename.field_2._8_8_ = plVar8[3];
    filename._M_dataplus._M_p = (pointer)&filename.field_2;
  }
  else {
    filename.field_2._M_allocated_capacity = *psVar10;
    filename._M_dataplus._M_p = (pointer)*plVar8;
  }
  filename._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,filename._M_dataplus._M_p,
             filename._M_dataplus._M_p + filename._M_string_length);
  readData(&local_238,dataNumber,pointTeam,0x1c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  maxPoolingInit(input,Matrix,3,2,1);
  maxPooling(input,Matrix,3,2);
  convolutionInit(weight,input,outpBox);
  convolution(weight,input,outpBox);
  BatchNorm(outpBox,beta,mean,var);
  relu(outpBox,weight->pbias);
  convolutionInit(weight_00,outpBox,outpBox_00);
  convolution(weight_00,outpBox,outpBox_00);
  BatchNorm(outpBox_00,beta_00,mean_00,var_00);
  relu(outpBox_00,weight_00->pbias);
  convolutionInit(weight_01,input,outpBox_01);
  convolution(weight_01,input,outpBox_01);
  BatchNorm(outpBox_01,beta_01,mean_01,var_01);
  relu(outpBox_01,weight_01->pbias);
  convolutionInit(weight_02,outpBox_01,outpBox_02);
  convolution(weight_02,outpBox_01,outpBox_02);
  BatchNorm(outpBox_02,beta_02,mean_02,var_02);
  relu(outpBox_02,weight_02->pbias);
  convolutionInit(weight_03,input,outpBox_03);
  convolution(weight_03,input,outpBox_03);
  BatchNorm(outpBox_03,beta_03,mean_03,var_03);
  relu(outpBox_03,weight_03->pbias);
  convolutionInit(weight_04,outpBox_03,outpBox_04);
  convolution(weight_04,outpBox_03,outpBox_04);
  BatchNorm(outpBox_04,beta_04,mean_04,var_04);
  relu(outpBox_04,weight_04->pbias);
  convolutionInit(weight_05,outpBox_04,outpBox_05);
  convolution(weight_05,outpBox_04,outpBox_05);
  BatchNorm(outpBox_05,beta_05,mean_05,var_05);
  relu(outpBox_05,weight_05->pbias);
  conv_mergeInit(output,outpBox_00,outpBox_02,outpBox_05,Matrix);
  conv_merge(output,outpBox_00,outpBox_02,outpBox_05,Matrix);
  freepBox(outpBox);
  freepBox(outpBox_00);
  freepBox(outpBox_01);
  freepBox(outpBox_02);
  freepBox(outpBox_03);
  freepBox(outpBox_04);
  freepBox(outpBox_05);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeWeight(weight_05);
  freepBox(Matrix);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  freeBN(var_03);
  freeBN(mean_03);
  freeBN(beta_03);
  freeBN(var_04);
  freeBN(mean_04);
  freeBN(beta_04);
  freeBN(var_05);
  freeBN(mean_05);
  freeBN(beta_05);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void facenet::Reduction_B(pBox *input, pBox *output) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;
    pBox *conv7_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;
    struct Weight *conv7_wb = new Weight;

    struct pBox *pooling1_out = new pBox;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;
    struct BN *conv5_var = new BN;
    struct BN *conv5_mean = new BN;
    struct BN *conv5_beta = new BN;
    struct BN *conv6_var = new BN;
    struct BN *conv6_mean = new BN;
    struct BN *conv6_beta = new BN;
    struct BN *conv7_var = new BN;
    struct BN *conv7_mean = new BN;
    struct BN *conv7_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 256);
    long conv2 = ConvAndFcInit(conv2_wb, 384, 256, 3, 2, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 384);

    long conv3 = ConvAndFcInit(conv3_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 256);
    long conv4 = ConvAndFcInit(conv4_wb, 256, 256, 3, 2, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 256);

    long conv5 = ConvAndFcInit(conv5_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv5_beta, conv5_mean, conv5_var, 256);
    long conv6 = ConvAndFcInit(conv6_wb, 256, 256, 3, 1, 1);
    BatchNormInit(conv6_beta, conv6_mean, conv6_var, 256);
    long conv7 = ConvAndFcInit(conv7_wb, 256, 256, 3, 2, 0);
    BatchNormInit(conv7_beta, conv7_mean, conv7_var, 256);

    long dataNumber[28] = {conv1, 256, 256, 256, conv2, 384, 384, 384, conv3, 256, 256, 256, conv4, 256, 256, 256,
                           conv5, 256, 256, 256, conv6, 256, 256, 256, conv7, 256, 256, 256};

//    mydataFmt *pointTeam[28] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_var->pdata, conv5_mean->pdata, conv5_beta->pdata, \
//                            conv6_wb->pdata, conv6_var->pdata, conv6_mean->pdata, conv6_beta->pdata, \
//                            conv7_wb->pdata, conv7_var->pdata, conv7_mean->pdata, conv7_beta->pdata};
    mydataFmt *pointTeam[28] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_beta->pdata, conv5_mean->pdata, conv5_var->pdata, \
                            conv6_wb->pdata, conv6_beta->pdata, conv6_mean->pdata, conv6_var->pdata, \
                            conv7_wb->pdata, conv7_beta->pdata, conv7_mean->pdata, conv7_var->pdata};
    string filename = "../model_" + to_string(Num) + "/Mixed_7a_list.txt";
    readData(filename, dataNumber, pointTeam, 28);


    maxPoolingInit(input, pooling1_out, 3, 2, 1);
    // 8*8*896
    maxPooling(input, pooling1_out, 3, 2);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 17 x 17 x 256
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
//    BatchNorm(conv1_out, conv1_var, conv1_mean, conv1_beta);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, conv1_out, conv2_out);
    //conv2 8 x 8 x 384
    convolution(conv2_wb, conv1_out, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
//    BatchNorm(conv2_out, conv2_var, conv2_mean, conv2_beta);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, input, conv3_out);
    //conv3 17 x 17 x 256
    convolution(conv3_wb, input, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
//    BatchNorm(conv3_out, conv3_var, conv3_mean, conv3_beta);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 8 x 8 x 256
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);

    convolutionInit(conv5_wb, input, conv5_out);
    //conv5 17 x 17 x 256
    convolution(conv5_wb, input, conv5_out);
    BatchNorm(conv5_out, conv5_beta, conv5_mean, conv5_var);
    relu(conv5_out, conv5_wb->pbias);

    convolutionInit(conv6_wb, conv5_out, conv6_out);
    //conv6 17 x 17 x 256
    convolution(conv6_wb, conv5_out, conv6_out);
    BatchNorm(conv6_out, conv6_beta, conv6_mean, conv6_var);
    relu(conv6_out, conv6_wb->pbias);

    convolutionInit(conv7_wb, conv6_out, conv7_out);
    //conv6 8 x 8 x 256
    convolution(conv7_wb, conv6_out, conv7_out);
    BatchNorm(conv7_out, conv7_beta, conv7_mean, conv7_var);
    relu(conv7_out, conv7_wb->pbias);

    conv_mergeInit(output, conv2_out, conv4_out, conv7_out, pooling1_out);
    //8*8*1792
    conv_merge(output, conv2_out, conv4_out, conv7_out, pooling1_out);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);
    freepBox(conv7_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);
    freeWeight(conv7_wb);

    freepBox(pooling1_out);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
    freeBN(conv5_var);
    freeBN(conv5_mean);
    freeBN(conv5_beta);
    freeBN(conv6_var);
    freeBN(conv6_mean);
    freeBN(conv6_beta);
    freeBN(conv7_var);
    freeBN(conv7_mean);
    freeBN(conv7_beta);
}